

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceMeasurer.hpp
# Opt level: O2

void __thiscall
deqp::gls::AttribSpec::AttribSpec
          (AttribSpec *this,char *name_,Vec4 *p00_,Vec4 *p01_,Vec4 *p10_,Vec4 *p11_)

{
  allocator<char> local_29;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,name_,&local_29);
  tcu::Vector<float,_4>::Vector(&this->p00,p00_);
  tcu::Vector<float,_4>::Vector(&this->p01,p01_);
  tcu::Vector<float,_4>::Vector(&this->p10,p10_);
  tcu::Vector<float,_4>::Vector(&this->p11,p11_);
  return;
}

Assistant:

AttribSpec (const char* name_, const tcu::Vec4& p00_, const tcu::Vec4& p01_, const tcu::Vec4& p10_, const tcu::Vec4& p11_)
		: name		(name_)
		, p00		(p00_)
		, p01		(p01_)
		, p10		(p10_)
		, p11		(p11_)
	{
	}